

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap1.c
# Opt level: O1

void Cffgiou(int *unit,int *status)

{
  ulong uVar1;
  
  if (0 < *status) {
    return;
  }
  uVar1 = 0x32;
  do {
    if (gFitsFiles[uVar1] == (fitsfile *)0x0) goto LAB_00158f3e;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 10000);
  uVar1 = 10000;
LAB_00158f3e:
  if ((int)uVar1 == 10000) {
    *unit = 0;
    *status = 0x67;
    ffpmsg("Cffgiou has no more available unit numbers.");
    return;
  }
  *unit = (int)uVar1;
  gFitsFiles[uVar1 & 0xffffffff] = (fitsfile *)0x1;
  return;
}

Assistant:

void Cffgiou( int *unit, int *status )
{
   int i;

   if( *status>0 ) return;
   FFLOCK;
   for( i=50;i<NMAXFILES;i++ ) /* Using a unit=0 sounds bad, so start at 1 */
      if( gFitsFiles[i]==NULL ) break;
   if( i==NMAXFILES ) {
      *unit = 0;
      *status = TOO_MANY_FILES;
      ffpmsg("Cffgiou has no more available unit numbers.");
   } else {
      *unit=i;
      gFitsFiles[i] = (fitsfile *)1; /*  Flag it as taken until ftopen/init  */
                                     /*  can be called and set a real value  */
   }
   FFUNLOCK;
}